

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::Constraint::Deserialize(Constraint *this,Deserializer *deserializer)

{
  ConstraintType CVar1;
  SerializationException *this_00;
  allocator local_41;
  _Alloc_hider local_40;
  
  CVar1 = Deserializer::ReadProperty<duckdb::ConstraintType>(deserializer,100,"type");
  this->_vptr_Constraint = (_func_int **)0x0;
  switch(CVar1) {
  case NOT_NULL:
    NotNullConstraint::Deserialize((NotNullConstraint *)&stack0xffffffffffffffc0,deserializer);
    break;
  case CHECK:
    CheckConstraint::Deserialize((CheckConstraint *)&stack0xffffffffffffffc0,deserializer);
    break;
  case UNIQUE:
    UniqueConstraint::Deserialize((UniqueConstraint *)&stack0xffffffffffffffc0,deserializer);
    break;
  case FOREIGN_KEY:
    ForeignKeyConstraint::Deserialize((ForeignKeyConstraint *)&stack0xffffffffffffffc0,deserializer)
    ;
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,
               "Unsupported type for deserialization of Constraint!",&local_41);
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_Constraint = (_func_int **)local_40._M_p;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> Constraint::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ConstraintType>(100, "type");
	unique_ptr<Constraint> result;
	switch (type) {
	case ConstraintType::CHECK:
		result = CheckConstraint::Deserialize(deserializer);
		break;
	case ConstraintType::FOREIGN_KEY:
		result = ForeignKeyConstraint::Deserialize(deserializer);
		break;
	case ConstraintType::NOT_NULL:
		result = NotNullConstraint::Deserialize(deserializer);
		break;
	case ConstraintType::UNIQUE:
		result = UniqueConstraint::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of Constraint!");
	}
	return result;
}